

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

void bcm2835_spi_end(void)

{
  bcm2835_gpio_fsel('\a','\0');
  bcm2835_gpio_fsel('\b','\0');
  bcm2835_gpio_fsel('\t','\0');
  bcm2835_gpio_fsel('\n','\0');
  bcm2835_gpio_fsel('\v','\0');
  return;
}

Assistant:

void bcm2835_spi_end(void)
{  
    /* Set all the SPI0 pins back to input */
    bcm2835_gpio_fsel(RPI_GPIO_P1_26, BCM2835_GPIO_FSEL_INPT); /* CE1 */
    bcm2835_gpio_fsel(RPI_GPIO_P1_24, BCM2835_GPIO_FSEL_INPT); /* CE0 */
    bcm2835_gpio_fsel(RPI_GPIO_P1_21, BCM2835_GPIO_FSEL_INPT); /* MISO */
    bcm2835_gpio_fsel(RPI_GPIO_P1_19, BCM2835_GPIO_FSEL_INPT); /* MOSI */
    bcm2835_gpio_fsel(RPI_GPIO_P1_23, BCM2835_GPIO_FSEL_INPT); /* CLK */
}